

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lite_unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::anon_unknown_0::ParseVarintTest_Varint32_Test::TestBody
          (ParseVarintTest_Varint32_Test *this)

{
  int in_EDX;
  int extraout_EDX;
  int varint_length;
  uint32_t value;
  uint32_t (*__range3) [5];
  uint uVar1;
  long lVar2;
  uint32_t values [5];
  
  uVar1 = 0x49;
  for (value = 1; value != 6; value = value + 1) {
    values[0] = uVar1 - 0x49;
    values[1] = uVar1 - 0x48;
    values[2] = uVar1;
    values[3] = uVar1 + 0x35;
    values[4] = uVar1 + 0x36;
    for (lVar2 = 0; lVar2 != 0x14; lVar2 = lVar2 + 4) {
      TestBody::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)(ulong)*(uint *)((long)values + lVar2),value,in_EDX);
      in_EDX = extraout_EDX;
    }
    uVar1 = uVar1 << 7 | 0x49;
  }
  TestBody::anon_class_1_0_00000001::operator()
            ((anon_class_1_0_00000001 *)0xffffffffffffffff,5,in_EDX);
  return;
}

Assistant:

TEST(ParseVarintTest, Varint32) {
  auto test_value = [](uint32_t value, int varint_length) {
    uint8_t buffer[10] = {0};
    uint8_t* p = io::CodedOutputStream::WriteVarint32ToArray(value, buffer);
    ASSERT_EQ(p - buffer, varint_length) << "Value = " << value;

    const char* cbuffer = reinterpret_cast<const char*>(buffer);
    uint32_t parsed = ~value;
    const char* r = internal::VarintParse(cbuffer, &parsed);
    ASSERT_EQ(r - cbuffer, varint_length) << "Value = " << value;
    ASSERT_EQ(parsed, value);
  };

  uint32_t base = 73;  // 1001011b
  for (int varint_length = 1; varint_length <= 5; ++varint_length) {
    uint32_t values[] = {
        base - 73, base - 72, base, base + 126 - 73, base + 126 - 72,
    };
    for (uint32_t value : values) {
      test_value(value, varint_length);
    }
    base = (base << 7) + 73;
  }

  test_value(std::numeric_limits<uint32_t>::max(), 5);
}